

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O2

shared_ptr<notch::core::FullyConnectedLayer> __thiscall notch::core::MakeLayer::FC(MakeLayer *this)

{
  valarray<float> *__args_1;
  element_type *__args_2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  MakeLayer *in_RSI;
  shared_ptr<notch::core::FullyConnectedLayer> sVar2;
  allocator local_39;
  string local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  
  if (in_RSI->maybeActivation == (Activation *)0x0) {
    in_RSI->maybeActivation = (Activation *)linearActivation;
  }
  __args_1 = (in_RSI->maybeWeights).
             super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((__args_1 == (valarray<float> *)0x0) ||
     (__args_2 = (in_RSI->maybeBias).
                 super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
     __args_2 == (element_type *)0x0)) {
    if ((in_RSI->nInputs == 0) || (in_RSI->nOutputs == 0)) {
      ::std::__cxx11::string::string((string *)&local_38,"a FullyConnectedLayer",&local_39);
      logic_error(in_RSI,&local_38);
      ::std::__cxx11::string::~string((string *)&local_38);
      this->nInputs = 0;
      this->nOutputs = 0;
      _Var1._M_pi = extraout_RDX;
    }
    else {
      sVar2 = ::std::
              make_shared<notch::core::FullyConnectedLayer,unsigned_long&,unsigned_long&,notch::core::Activation_const&>
                        (&this->nInputs,&in_RSI->nInputs,(Activation *)&in_RSI->nOutputs);
      _Var1 = sVar2.super___shared_ptr<notch::core::FullyConnectedLayer,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi;
    }
  }
  else {
    sVar2 = ::std::
            make_shared<notch::core::FullyConnectedLayer,std::valarray<float>&,std::valarray<float>&,notch::core::Activation_const&>
                      ((valarray<float> *)this,__args_1,(Activation *)__args_2);
    _Var1 = sVar2.super___shared_ptr<notch::core::FullyConnectedLayer,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  }
  sVar2.super___shared_ptr<notch::core::FullyConnectedLayer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = _Var1._M_pi;
  sVar2.super___shared_ptr<notch::core::FullyConnectedLayer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<notch::core::FullyConnectedLayer>)
         sVar2.super___shared_ptr<notch::core::FullyConnectedLayer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<FullyConnectedLayer> FC() {
        if (!maybeActivation) {
            maybeActivation = &linearActivation;
        }
        if (maybeWeights && maybeBias) {
            return std::make_shared<FullyConnectedLayer>
                (*maybeWeights, *maybeBias, *maybeActivation);
        } else if (nInputs && nOutputs) {
            return std::make_shared<FullyConnectedLayer>
                (nInputs, nOutputs, *maybeActivation);
        } else {
            logic_error("a FullyConnectedLayer");
            return nullptr; // unreachable
        }
    }